

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O0

void __thiscall
pbrt::anon_class_1_0_00000001::operator()(anon_class_1_0_00000001 *this,StatsAccumulator *accum)

{
  long *in_FS_OFFSET;
  int64_t in_stack_00000040;
  char *in_stack_00000048;
  StatsAccumulator *in_stack_00000050;
  
  StatsAccumulator::ReportCounter(in_stack_00000050,in_stack_00000048,in_stack_00000040);
  *(undefined8 *)(*in_FS_OFFSET + -0x378) = 0;
  return;
}

Assistant:

pstd::optional<ShapeIntersection> Integrator::Intersect(const Ray &ray,
                                                        Float tMax) const {
    ++nIntersectionTests;
    DCHECK_NE(ray.d, Vector3f(0, 0, 0));
    if (aggregate)
        return aggregate.Intersect(ray, tMax);
    else
        return {};
}